

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

int32_t __thiscall
sptk::reaper::EpochTracker::FindNccfPeaks
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float thresh,
          vector<short,_std::allocator<short>_> *output)

{
  float fVar1;
  short sVar2;
  pointer pfVar3;
  iterator iVar4;
  pointer psVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  int16_t max_index;
  short local_3c;
  short local_3a;
  float local_38;
  float local_34;
  
  iVar8 = (int)((ulong)((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  local_3a = 1;
  uVar9 = 0;
  local_38 = thresh;
  std::vector<short,_std::allocator<short>_>::resize(output,0);
  local_3c = 1;
  uVar7 = 0;
  if (1 < iVar8) {
    fVar11 = 0.0;
    uVar7 = 0;
    uVar9 = 0;
    fVar10 = local_38;
    do {
      lVar6 = (long)local_3c;
      pfVar3 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar1 = pfVar3[lVar6];
      if (((fVar10 < fVar1) && (pfVar3[lVar6 + -1] <= fVar1 && fVar1 != pfVar3[lVar6 + -1])) &&
         (pfVar3[lVar6 + 1] <= fVar1)) {
        if (fVar11 < fVar1) {
          fVar11 = fVar1;
          uVar9 = uVar7;
          local_3a = local_3c;
        }
        uVar7 = uVar7 + 1;
        iVar4._M_current =
             (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_34 = fVar11;
          std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                    ((vector<short,std::allocator<short>> *)output,iVar4,&local_3c);
          fVar10 = local_38;
          fVar11 = local_34;
        }
        else {
          *iVar4._M_current = local_3c;
          (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      local_3c = local_3c + 1;
    } while (local_3c < iVar8);
  }
  if (uVar7 < 2 || (short)uVar9 < 1) {
    if (uVar7 == 0) {
      iVar4._M_current =
           (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                  ((vector<short,std::allocator<short>> *)output,iVar4,&local_3a);
      }
      else {
        *iVar4._M_current = local_3a;
        (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar4._M_current + 1;
      }
      uVar7 = 1;
    }
  }
  else {
    psVar5 = (output->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = *psVar5;
    *psVar5 = psVar5[uVar9 & 0xffff];
    psVar5[uVar9 & 0xffff] = sVar2;
  }
  return uVar7;
}

Assistant:

int32_t EpochTracker::FindNccfPeaks(const std::vector<float>& input, float thresh,
                                    std::vector<int16_t>* output) {
  int32_t limit = input.size() - 1;
  uint32_t n_peaks = 0;
  float max_val = 0.0;
  int16_t max_index = 1;
  int16_t max_out_index = 0;
  output->resize(0);
  for (int16_t i = 1; i < limit; ++i) {
    float val = input[i];
    if ((val > thresh) && (val > input[i-1]) && (val >= input[i+1])) {
      if (val > max_val) {
        max_val = val;
        max_out_index = n_peaks;
        max_index = i;
      }
      n_peaks++;
      output->push_back(i);
    }
  }
  //  Be sure the highest peak is the first one in the array.
  if ((n_peaks > 1) && (max_out_index > 0)) {
    int16_t hold = (*output)[0];
    (*output)[0] = (*output)[max_out_index];
    (*output)[max_out_index] = hold;
  } else {
    if (n_peaks <= 0) {
      n_peaks = 1;
      output->push_back(max_index);
    }
  }
  return n_peaks;
}